

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O0

void __thiscall
adios2::transport::FileStdio::Read(FileStdio *this,char *buffer,size_t size,size_t start)

{
  long in_RCX;
  ulong in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t b;
  size_t position;
  size_t remainder;
  size_t batches;
  string *in_stack_00000088;
  FileStdio *in_stack_00000090;
  size_t in_stack_00000110;
  char *in_stack_00000118;
  anon_class_8_1_8991fb9c *in_stack_00000120;
  int status;
  anon_class_8_1_8991fb9c lf_Read;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ulong local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffefc;
  FileStdio *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [36];
  int local_2c;
  long local_20;
  ulong local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  WaitForOpen(in_stack_ffffffffffffff00);
  if (local_20 != -1) {
    local_2c = fseek((FILE *)in_RDI[7].field_2._M_allocated_capacity,local_20,0);
    __rhs = &local_f0;
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffee8);
    std::operator+((char *)in_RDI,__rhs);
    std::operator+(in_RDI,(char *)__rhs);
    std::operator+(in_RDI,__rhs);
    std::operator+(in_RDI,(char *)__rhs);
    std::__cxx11::to_string(in_stack_fffffffffffffefc);
    std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    CheckFile(in_stack_00000090,in_stack_00000088);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  if (local_18 < 0x7ffe7001) {
    Read::anon_class_8_1_8991fb9c::operator()(in_stack_00000120,in_stack_00000118,in_stack_00000110)
    ;
  }
  else {
    for (local_140 = 0; local_140 < local_18 / 0x7ffe7000; local_140 = local_140 + 1) {
      Read::anon_class_8_1_8991fb9c::operator()
                (in_stack_00000120,in_stack_00000118,in_stack_00000110);
    }
    Read::anon_class_8_1_8991fb9c::operator()(in_stack_00000120,in_stack_00000118,in_stack_00000110)
    ;
  }
  return;
}

Assistant:

void FileStdio::Read(char *buffer, size_t size, size_t start)
{
    auto lf_Read = [&](char *buffer, size_t size) {
        ProfilerStart("read");
        const auto readSize = std::fread(buffer, sizeof(char), size, m_File);
        ProfilerStop("read");

        CheckFile("couldn't read to file " + m_Name + ", in call to stdio fread");

        if (readSize != size)
        {
            helper::Throw<std::ios_base::failure>(
                "Toolkit", "transport::file::FileStdio", "Read",
                "read size of " + std::to_string(readSize) + " is not equal to intended size " +
                    std::to_string(size) + " in file " + m_Name + ", in call to stdio fread");
        }
    };

    WaitForOpen();
    if (start != MaxSizeT)
    {
        const auto status = std::fseek(m_File, static_cast<long int>(start), SEEK_SET);
        CheckFile("couldn't move to start position " + std::to_string(start) + " in file " +
                  m_Name + ", in call to stdio fseek for read, result=" + std::to_string(status));
    }

    if (size > DefaultMaxFileBatchSize)
    {
        const size_t batches = size / DefaultMaxFileBatchSize;
        const size_t remainder = size % DefaultMaxFileBatchSize;

        size_t position = 0;
        for (size_t b = 0; b < batches; ++b)
        {
            lf_Read(&buffer[position], DefaultMaxFileBatchSize);
            position += DefaultMaxFileBatchSize;
        }
        lf_Read(&buffer[position], remainder);
    }
    else
    {
        lf_Read(buffer, size);
    }
}